

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O0

void __thiscall
google::protobuf::DescriptorPool::FindAllExtensions
          (DescriptorPool *this,Descriptor *extendee,
          vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
          *out)

{
  byte bVar1;
  Tables *this_00;
  string *extendee_00;
  unordered_set<const_google::protobuf::Descriptor_*,_std::hash<const_google::protobuf::Descriptor_*>,_std::equal_to<const_google::protobuf::Descriptor_*>,_std::allocator<const_google::protobuf::Descriptor_*>_>
  *puVar2;
  reference pvVar3;
  Descriptor *in_RDX;
  DescriptorPool *in_RSI;
  long in_RDI;
  pair<std::__detail::_Node_iterator<const_google::protobuf::Descriptor_*,_true,_false>,_bool> pVar4
  ;
  int number;
  int i;
  vector<int,_std::allocator<int>_> numbers;
  int in_stack_0000007c;
  Descriptor *in_stack_00000080;
  MutexLockMaybe lock;
  undefined7 in_stack_ffffffffffffff58;
  undefined1 in_stack_ffffffffffffff5f;
  _Node_iterator_base<const_google::protobuf::Descriptor_*,_false> in_stack_ffffffffffffff60;
  FieldDescriptor *in_stack_ffffffffffffff68;
  unordered_set<const_google::protobuf::Descriptor_*,_std::hash<const_google::protobuf::Descriptor_*>,_std::equal_to<const_google::protobuf::Descriptor_*>,_std::allocator<const_google::protobuf::Descriptor_*>_>
  *in_stack_ffffffffffffff70;
  long *plVar5;
  value_type in_stack_ffffffffffffffb0;
  int in_stack_ffffffffffffffb4;
  Descriptor *in_stack_ffffffffffffffb8;
  Tables *in_stack_ffffffffffffffc0;
  vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  *in_stack_ffffffffffffffe0;
  
  internal::MutexLockMaybe::MutexLockMaybe
            ((MutexLockMaybe *)in_stack_ffffffffffffff60._M_cur,
             (Mutex *)CONCAT17(in_stack_ffffffffffffff5f,in_stack_ffffffffffffff58));
  if (*(long *)(in_RDI + 8) != 0) {
    std::
    unique_ptr<google::protobuf::DescriptorPool::Tables,_std::default_delete<google::protobuf::DescriptorPool::Tables>_>
    ::operator->((unique_ptr<google::protobuf::DescriptorPool::Tables,_std::default_delete<google::protobuf::DescriptorPool::Tables>_>
                  *)0x4a3996);
    std::
    unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::clear((unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)0x4a39a2);
    std::
    unique_ptr<google::protobuf::DescriptorPool::Tables,_std::default_delete<google::protobuf::DescriptorPool::Tables>_>
    ::operator->((unique_ptr<google::protobuf::DescriptorPool::Tables,_std::default_delete<google::protobuf::DescriptorPool::Tables>_>
                  *)0x4a39b0);
    std::
    unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::clear((unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)0x4a39bc);
  }
  if (*(long *)(in_RDI + 8) != 0) {
    std::
    unique_ptr<google::protobuf::DescriptorPool::Tables,_std::default_delete<google::protobuf::DescriptorPool::Tables>_>
    ::operator->((unique_ptr<google::protobuf::DescriptorPool::Tables,_std::default_delete<google::protobuf::DescriptorPool::Tables>_>
                  *)0x4a39da);
    this_00 = (Tables *)
              std::
              unordered_set<const_google::protobuf::Descriptor_*,_std::hash<const_google::protobuf::Descriptor_*>,_std::equal_to<const_google::protobuf::Descriptor_*>,_std::allocator<const_google::protobuf::Descriptor_*>_>
              ::count((unordered_set<const_google::protobuf::Descriptor_*,_std::hash<const_google::protobuf::Descriptor_*>,_std::equal_to<const_google::protobuf::Descriptor_*>,_std::allocator<const_google::protobuf::Descriptor_*>_>
                       *)in_stack_ffffffffffffff60._M_cur,
                      (key_type *)CONCAT17(in_stack_ffffffffffffff5f,in_stack_ffffffffffffff58));
    if (this_00 == (Tables *)0x0) {
      std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)0x4a3a11);
      plVar5 = *(long **)(in_RDI + 8);
      extendee_00 = Descriptor::full_name_abi_cxx11_((Descriptor *)in_RSI);
      bVar1 = (**(code **)(*plVar5 + 0x28))(plVar5,extendee_00,&stack0xffffffffffffffb8);
      if ((bVar1 & 1) != 0) {
        in_stack_ffffffffffffffb4 = 0;
        while( true ) {
          in_stack_ffffffffffffff70 =
               (unordered_set<const_google::protobuf::Descriptor_*,_std::hash<const_google::protobuf::Descriptor_*>,_std::equal_to<const_google::protobuf::Descriptor_*>,_std::allocator<const_google::protobuf::Descriptor_*>_>
                *)(long)in_stack_ffffffffffffffb4;
          puVar2 = (unordered_set<const_google::protobuf::Descriptor_*,_std::hash<const_google::protobuf::Descriptor_*>,_std::equal_to<const_google::protobuf::Descriptor_*>,_std::allocator<const_google::protobuf::Descriptor_*>_>
                    *)std::vector<int,_std::allocator<int>_>::size
                                ((vector<int,_std::allocator<int>_> *)&stack0xffffffffffffffb8);
          if (puVar2 <= in_stack_ffffffffffffff70) break;
          pvVar3 = std::vector<int,_std::allocator<int>_>::operator[]
                             ((vector<int,_std::allocator<int>_> *)&stack0xffffffffffffffb8,
                              (long)in_stack_ffffffffffffffb4);
          in_stack_ffffffffffffffb0 = *pvVar3;
          std::
          unique_ptr<google::protobuf::DescriptorPool::Tables,_std::default_delete<google::protobuf::DescriptorPool::Tables>_>
          ::operator->((unique_ptr<google::protobuf::DescriptorPool::Tables,_std::default_delete<google::protobuf::DescriptorPool::Tables>_>
                        *)0x4a3aae);
          in_stack_ffffffffffffff68 =
               Tables::FindExtension(this_00,(Descriptor *)extendee_00,(int)((ulong)plVar5 >> 0x20))
          ;
          if (in_stack_ffffffffffffff68 == (FieldDescriptor *)0x0) {
            TryFindExtensionInFallbackDatabase
                      ((DescriptorPool *)lock.mu_,in_stack_00000080,in_stack_0000007c);
          }
          in_stack_ffffffffffffffb4 = in_stack_ffffffffffffffb4 + 1;
        }
        std::
        unique_ptr<google::protobuf::DescriptorPool::Tables,_std::default_delete<google::protobuf::DescriptorPool::Tables>_>
        ::operator->((unique_ptr<google::protobuf::DescriptorPool::Tables,_std::default_delete<google::protobuf::DescriptorPool::Tables>_>
                      *)0x4a3b44);
        pVar4 = std::
                unordered_set<const_google::protobuf::Descriptor_*,_std::hash<const_google::protobuf::Descriptor_*>,_std::equal_to<const_google::protobuf::Descriptor_*>,_std::allocator<const_google::protobuf::Descriptor_*>_>
                ::insert(in_stack_ffffffffffffff70,(value_type *)in_stack_ffffffffffffff68);
        in_stack_ffffffffffffff60._M_cur =
             (__node_type *)
             pVar4.first.super__Node_iterator_base<const_google::protobuf::Descriptor_*,_false>.
             _M_cur;
      }
      std::vector<int,_std::allocator<int>_>::~vector
                ((vector<int,_std::allocator<int>_> *)in_stack_ffffffffffffff70);
    }
  }
  std::
  unique_ptr<google::protobuf::DescriptorPool::Tables,_std::default_delete<google::protobuf::DescriptorPool::Tables>_>
  ::operator->((unique_ptr<google::protobuf::DescriptorPool::Tables,_std::default_delete<google::protobuf::DescriptorPool::Tables>_>
                *)0x4a3b90);
  Tables::FindAllExtensions
            (in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,
             (vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
              *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0));
  if (*(long *)(in_RDI + 0x18) != 0) {
    FindAllExtensions(in_RSI,in_RDX,in_stack_ffffffffffffffe0);
  }
  internal::MutexLockMaybe::~MutexLockMaybe((MutexLockMaybe *)in_stack_ffffffffffffff60._M_cur);
  return;
}

Assistant:

void DescriptorPool::FindAllExtensions(
    const Descriptor* extendee,
    std::vector<const FieldDescriptor*>* out) const {
  MutexLockMaybe lock(mutex_);
  if (fallback_database_ != nullptr) {
    tables_->known_bad_symbols_.clear();
    tables_->known_bad_files_.clear();
  }

  // Initialize tables_->extensions_ from the fallback database first
  // (but do this only once per descriptor).
  if (fallback_database_ != nullptr &&
      tables_->extensions_loaded_from_db_.count(extendee) == 0) {
    std::vector<int> numbers;
    if (fallback_database_->FindAllExtensionNumbers(extendee->full_name(),
                                                    &numbers)) {
      for (int i = 0; i < numbers.size(); ++i) {
        int number = numbers[i];
        if (tables_->FindExtension(extendee, number) == nullptr) {
          TryFindExtensionInFallbackDatabase(extendee, number);
        }
      }
      tables_->extensions_loaded_from_db_.insert(extendee);
    }
  }

  tables_->FindAllExtensions(extendee, out);
  if (underlay_ != nullptr) {
    underlay_->FindAllExtensions(extendee, out);
  }
}